

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glob-filter.c++
# Opt level: O3

bool __thiscall kj::GlobFilter::matches(GlobFilter *this,StringPtr name)

{
  Vector<unsigned_int> *this_00;
  char c;
  ArrayDisposer *pAVar1;
  size_t sVar2;
  StringPtr *pSVar3;
  StringPtr *pSVar4;
  StringPtr *pSVar5;
  ulong uVar6;
  uint *target;
  uint *puVar7;
  uint *puVar8;
  char *pcVar9;
  ulong uVar10;
  StringPtr *pSVar11;
  uint uVar12;
  uint *__end2;
  StringPtr *pSVar13;
  uint *ptrCopy;
  StringPtr *pSVar14;
  bool bVar15;
  Vector<unsigned_int> scratch;
  ArrayBuilder<kj::StringPtr> local_88;
  StringPtr *local_68;
  char *local_60;
  StringPtr *local_58;
  StringPtr *local_50;
  StringPtr *local_48;
  StringPtr *local_40;
  ArrayDisposer *local_38;
  
  pcVar9 = name.content.ptr;
  this_00 = &this->states;
  puVar7 = (this->states).builder.ptr;
  (this->states).builder.pos = puVar7;
  if (puVar7 == (this->states).builder.endPtr) {
    Vector<unsigned_int>::setCapacity(this_00,4);
    puVar7 = (this->states).builder.pos;
  }
  *puVar7 = 0;
  puVar7 = puVar7 + 1;
  (this->states).builder.pos = puVar7;
  local_88.ptr = (StringPtr *)0x0;
  local_88.pos = (StringPtr *)0x0;
  local_88.endPtr = (StringPtr *)0x0;
  local_88.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  local_60 = pcVar9 + (name.content.size_ - 1);
  if (local_60 == pcVar9) {
    pSVar13 = (StringPtr *)0x0;
    pSVar11 = (StringPtr *)0x0;
    pSVar14 = (StringPtr *)0x0;
  }
  else {
    do {
      c = *pcVar9;
      pSVar11 = (StringPtr *)(this->states).builder.ptr;
      pSVar13 = (StringPtr *)(this->states).builder.pos;
      local_58 = (StringPtr *)(this->states).builder.endPtr;
      pAVar1 = (this->states).builder.disposer;
      (this_00->builder).ptr = (uint *)0x0;
      (this->states).builder.pos = (RemoveConst<unsigned_int> *)0x0;
      (this->states).builder.endPtr = (uint *)0x0;
      local_50 = pSVar11;
      local_48 = pSVar13;
      local_40 = local_58;
      local_38 = pAVar1;
      ArrayBuilder<unsigned_int>::operator=(&this_00->builder,&local_88);
      puVar7 = (this->states).builder.ptr;
      puVar8 = (this->states).builder.endPtr;
      (this->states).builder.pos = puVar7;
      if ((c == '\\') ||
         (pSVar3 = local_88.ptr, pSVar4 = local_88.pos, pSVar5 = local_88.endPtr, pSVar14 = pSVar11,
         c == '/')) {
        local_68 = pSVar11;
        if (puVar7 == puVar8) {
          Vector<unsigned_int>::setCapacity(this_00,4);
          puVar7 = (this->states).builder.pos;
        }
        *puVar7 = 0;
        (this->states).builder.pos = puVar7 + 1;
        pSVar3 = local_88.ptr;
        pSVar4 = local_88.pos;
        pSVar5 = local_88.endPtr;
        pSVar11 = local_68;
        pSVar14 = local_68;
      }
      for (; local_68 = pSVar14, pSVar11 != pSVar13;
          pSVar11 = (StringPtr *)((long)&(pSVar11->content).ptr + 4)) {
        local_88.ptr = pSVar3;
        local_88.pos = pSVar4;
        local_88.endPtr = pSVar5;
        applyState(this,c,*(uint *)&(pSVar11->content).ptr);
        pSVar3 = local_88.ptr;
        pSVar4 = local_88.pos;
        pSVar5 = local_88.endPtr;
        pSVar14 = local_68;
      }
      if (pSVar3 != (StringPtr *)0x0) {
        local_88.ptr = (StringPtr *)0x0;
        local_88.pos = (RemoveConst<kj::StringPtr> *)0x0;
        local_88.endPtr = (StringPtr *)0x0;
        (**(local_88.disposer)->_vptr_ArrayDisposer)
                  (local_88.disposer,pSVar3,4,(long)pSVar4 - (long)pSVar3 >> 2,
                   (long)pSVar5 - (long)pSVar3 >> 2,0);
      }
      local_88.endPtr = local_58;
      pcVar9 = pcVar9 + 1;
      local_88.ptr = pSVar14;
      local_88.pos = pSVar13;
      local_88.disposer = pAVar1;
    } while (pcVar9 != local_60);
    puVar7 = (this->states).builder.pos;
    pSVar11 = local_58;
  }
  puVar8 = (this_00->builder).ptr;
  if (puVar8 == puVar7) {
    bVar15 = false;
  }
  else {
    sVar2 = (this->pattern).content.size_;
    uVar10 = 0;
    if (sVar2 != 0) {
      uVar10 = sVar2 - 1;
    }
    do {
      uVar12 = *puVar8;
      do {
        uVar6 = (ulong)uVar12;
        if (uVar10 <= uVar6) break;
        uVar12 = uVar12 + 1;
      } while ((this->pattern).content.ptr[uVar6] == '*');
      bVar15 = uVar10 == uVar6;
    } while ((!bVar15) && (puVar8 = puVar8 + 1, puVar8 != puVar7));
  }
  if (pSVar14 != (StringPtr *)0x0) {
    local_88.ptr = (StringPtr *)0x0;
    local_88.pos = (RemoveConst<kj::StringPtr> *)0x0;
    local_88.endPtr = (StringPtr *)0x0;
    (**(local_88.disposer)->_vptr_ArrayDisposer)
              (local_88.disposer,pSVar14,4,(long)pSVar13 - (long)pSVar14 >> 2,
               (long)pSVar11 - (long)pSVar14 >> 2,0);
  }
  return bVar15;
}

Assistant:

bool GlobFilter::matches(StringPtr name) {
  // Get out your computer science books. We're implementing a non-deterministic finite automaton.
  //
  // Our NDFA has one "state" corresponding to each character in the pattern.
  //
  // As you may recall, an NDFA can be transformed into a DFA where every state in the DFA
  // represents some combination of states in the NDFA. Therefore, we actually have to store a
  // list of states here. (Actually, what we really want is a set of states, but because our
  // patterns are mostly non-cyclic a list of states should work fine and be a bit more efficient.)

  // Our state list starts out pointing only at the start of the pattern.
  states.resize(0);
  states.add(0);

  Vector<uint> scratch;

  // Iterate through each character in the name.
  for (char c: name) {
    // Pull the current set of states off to the side, so that we can populate `states` with the
    // new set of states.
    Vector<uint> oldStates = kj::mv(states);
    states = kj::mv(scratch);
    states.resize(0);

    // The pattern can omit a leading path. So if we're at a '/' then enter the state machine at
    // the beginning on the next char.
    if (c == '/' || c == '\\') {
      states.add(0);
    }

    // Process each state.
    for (uint state: oldStates) {
      applyState(c, state);
    }

    // Store the previous state vector for reuse.
    scratch = kj::mv(oldStates);
  }

  // If any one state is at the end of the pattern (or at a wildcard just before the end of the
  // pattern), we have a match.
  for (uint state: states) {
    while (state < pattern.size() && pattern[state] == '*') {
      ++state;
    }
    if (state == pattern.size()) {
      return true;
    }
  }
  return false;
}